

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::VisitEntry(cmComputeLinkDepends *this,int index)

{
  int *piVar1;
  uint component;
  long lVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  uint *puVar3;
  iterator __position;
  PendingComponent *pPVar4;
  cmComputeComponentGraph *pcVar5;
  cmGraphEdge *oi;
  long lVar6;
  uint *puVar7;
  int local_2c;
  
  local_2c = index;
  std::vector<int,_std::allocator<int>_>::push_back(&this->FinalLinkOrder,&local_2c);
  component = *(uint *)(*(long *)&(((this->CCG)._M_t.
                                    super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                                    .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>.
                                   _M_head_impl)->TarjanComponents).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl +
                       (long)local_2c * 4);
  lVar6 = (long)(int)component;
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::PendingComponent>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
               ::find(&(this->PendingComponents)._M_t,
                      (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header) {
    pcVar5 = (this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
    lVar2 = *(long *)&(pcVar5->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl;
    if (4 < (ulong)(*(long *)(lVar2 + 8 + lVar6 * 0x18) - *(long *)(lVar2 + lVar6 * 0x18))) {
      pPVar4 = MakePendingComponent(this,component);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (&(pPVar4->Entries)._M_t,&local_2c);
      return;
    }
  }
  else {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &__position._M_node[1]._M_left,&local_2c);
    if (__position._M_node[2]._M_right != (_Base_ptr)0x0) {
      return;
    }
    piVar1 = (int *)((long)&__position._M_node[1]._M_parent + 4);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      lVar2 = *(long *)&(((this->CCG)._M_t.
                          super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                          .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl)->
                        Components).
                        super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                        _M_impl;
      __first._M_current = *(int **)(lVar2 + lVar6 * 0x18);
      __last._M_current = *(int **)(lVar2 + 8 + lVar6 * 0x18);
      if (4 < (ulong)((long)__last._M_current - (long)__first._M_current)) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &__position._M_node[1]._M_left,__first,__last);
        return;
      }
      __assert_fail("nl.size() > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmComputeLinkDepends.cxx"
                    ,0x2e6,"void cmComputeLinkDepends::VisitEntry(int)");
    }
    std::
    _Rb_tree<int,std::pair<int_const,cmComputeLinkDepends::PendingComponent>,std::_Select1st<std::pair<int_const,cmComputeLinkDepends::PendingComponent>>,std::less<int>,std::allocator<std::pair<int_const,cmComputeLinkDepends::PendingComponent>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,cmComputeLinkDepends::PendingComponent>,std::_Select1st<std::pair<int_const,cmComputeLinkDepends::PendingComponent>>,std::less<int>,std::allocator<std::pair<int_const,cmComputeLinkDepends::PendingComponent>>>
                        *)&this->PendingComponents,__position);
    pcVar5 = (this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  }
  lVar2 = *(long *)&(pcVar5->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl;
  puVar3 = *(uint **)(lVar2 + 8 + lVar6 * 0x18);
  for (puVar7 = *(uint **)(lVar2 + lVar6 * 0x18); puVar7 != puVar3; puVar7 = puVar7 + 6) {
    MakePendingComponent(this,*puVar7);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitEntry(int index)
{
  // Include this entry on the link line.
  this->FinalLinkOrder.push_back(index);

  // This entry has now been seen.  Update its component.
  bool completed = false;
  int component = this->CCG->GetComponentMap()[index];
  std::map<int, PendingComponent>::iterator mi =
    this->PendingComponents.find(this->ComponentOrder[component]);
  if (mi != this->PendingComponents.end()) {
    // The entry is in an already pending component.
    PendingComponent& pc = mi->second;

    // Remove the entry from those pending in its component.
    pc.Entries.erase(index);
    if (pc.Entries.empty()) {
      // The complete component has been seen since it was last needed.
      --pc.Count;

      if (pc.Count == 0) {
        // The component has been completed.
        this->PendingComponents.erase(mi);
        completed = true;
      } else {
        // The whole component needs to be seen again.
        NodeList const& nl = this->CCG->GetComponent(component);
        assert(nl.size() > 1);
        pc.Entries.insert(nl.begin(), nl.end());
      }
    }
  } else {
    // The entry is not in an already pending component.
    NodeList const& nl = this->CCG->GetComponent(component);
    if (nl.size() > 1) {
      // This is a non-trivial component.  It is now pending.
      PendingComponent& pc = this->MakePendingComponent(component);

      // The starting entry has already been seen.
      pc.Entries.erase(index);
    } else {
      // This is a trivial component, so it is already complete.
      completed = true;
    }
  }

  // If the entry completed a component, the component's dependencies
  // are now pending.
  if (completed) {
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(component);
    for (cmGraphEdge const& oi : ol) {
      // This entire component is now pending no matter whether it has
      // been partially seen already.
      this->MakePendingComponent(oi);
    }
  }
}